

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnHorizPalCommand::Execute(DrawColumnHorizPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int core_skip;
  ulong uVar7;
  int pass_skip;
  uint uVar8;
  int iVar9;
  
  iVar9 = (this->super_PalColumnHorizCommand)._yl;
  uVar4 = thread->pass_end_y - iVar9;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar8 = (this->super_PalColumnHorizCommand)._count;
  if ((int)uVar8 < (int)uVar4) {
    uVar4 = uVar8;
  }
  iVar1 = thread->num_cores;
  uVar8 = thread->pass_start_y - iVar9;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar5 = (iVar1 - (int)((iVar9 + uVar8) - thread->core) % iVar1) % iVar1;
  uVar7 = (long)(int)((~uVar8 + iVar1 + uVar4) - iVar5) / (long)iVar1;
  if (0 < (int)(uint)uVar7) {
    iVar6 = (this->super_PalColumnHorizCommand)._iscale;
    puVar2 = (this->super_PalColumnHorizCommand)._source;
    puVar3 = thread->dc_temp +
             (ulong)((this->super_PalColumnHorizCommand)._x & 3) +
             (long)((int)(iVar9 + uVar8 + iVar5) / iVar1) * 4;
    iVar9 = (uVar8 + iVar5) * iVar6 + (this->super_PalColumnHorizCommand)._texturefrac;
    iVar6 = iVar6 * iVar1;
    if ((uVar7 & 1) != 0) {
      *puVar3 = puVar2[iVar9 >> 0x10];
      puVar3 = puVar3 + 4;
      iVar9 = iVar9 + iVar6;
    }
    if ((uVar7 & 2) != 0) {
      *puVar3 = puVar2[iVar9 >> 0x10];
      puVar3[4] = puVar2[iVar9 + iVar6 >> 0x10];
      iVar9 = iVar9 + iVar6 + iVar6;
      puVar3 = puVar3 + 8;
    }
    if ((uVar7 & 4) != 0) {
      *puVar3 = puVar2[iVar9 >> 0x10];
      puVar3[4] = puVar2[iVar9 + iVar6 >> 0x10];
      iVar9 = iVar9 + iVar6 + iVar6;
      puVar3[8] = puVar2[iVar9 >> 0x10];
      iVar9 = iVar9 + iVar6;
      puVar3[0xc] = puVar2[iVar9 >> 0x10];
      iVar9 = iVar9 + iVar6;
      puVar3 = puVar3 + 0x10;
    }
    if (7 < (uint)uVar7) {
      uVar7 = (uVar7 & 0xffffffff) >> 3;
      do {
        *puVar3 = puVar2[iVar9 >> 0x10];
        puVar3[4] = puVar2[iVar9 + iVar6 >> 0x10];
        puVar3[8] = puVar2[iVar6 * 2 + iVar9 >> 0x10];
        puVar3[0xc] = puVar2[iVar6 * 3 + iVar9 >> 0x10];
        puVar3[0x10] = puVar2[iVar6 * 4 + iVar9 >> 0x10];
        puVar3[0x14] = puVar2[iVar6 * 5 + iVar9 >> 0x10];
        puVar3[0x18] = puVar2[iVar6 * 6 + iVar9 >> 0x10];
        puVar3[0x1c] = puVar2[iVar9 + iVar6 * 7 >> 0x10];
        puVar3 = puVar3 + 0x20;
        uVar4 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar4;
        iVar9 = iVar9 + iVar6 + iVar6 * 7;
      } while (uVar4 != 0);
    }
  }
  return;
}

Assistant:

void DrawColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t *dest;
		fixed_t fracstep;
		fixed_t frac;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		fracstep = _iscale;
		frac = _texturefrac;

		const uint8_t *source = _source;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];
		frac += fracstep * thread->skipped_by_thread(_yl);
		fracstep *= thread->num_cores;

		if (count & 1) {
			*dest = source[frac >> FRACBITS]; dest += 4; frac += fracstep;
		}
		if (count & 2) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 8;
		}
		if (count & 4) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 16;
		}
		count >>= 3;
		if (!count) return;

		do
		{
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest[16] = source[frac >> FRACBITS]; frac += fracstep;
			dest[20] = source[frac >> FRACBITS]; frac += fracstep;
			dest[24] = source[frac >> FRACBITS]; frac += fracstep;
			dest[28] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 32;
		} while (--count);
	}